

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O3

deUint32 __thiscall
tcu::astc::anon_unknown_0::BitAccessStream::getNext(BitAccessStream *this,int num)

{
  int iVar1;
  int iVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar9;
  int iVar8;
  
  dVar3 = 0;
  if (num != 0) {
    iVar8 = this->m_length;
    iVar1 = this->m_ndx;
    dVar3 = 0;
    if (iVar1 < iVar8) {
      iVar2 = num + iVar1;
      if (iVar2 <= iVar8) {
        iVar8 = iVar2;
      }
      uVar7 = iVar8 - iVar1;
      dVar3 = 0;
      uVar9 = 0;
      if (0 < (int)uVar7) {
        uVar9 = uVar7;
      }
      iVar5 = iVar1 + uVar9 + -1;
      this->m_ndx = iVar2;
      iVar8 = this->m_startNdxInSrc;
      if (this->m_forward == true) {
        dVar3 = Block128::getBits(this->m_src,iVar1 + iVar8,iVar5 + iVar8);
        return dVar3;
      }
      dVar4 = Block128::getBits(this->m_src,iVar8 - iVar5,iVar8 - iVar1);
      if (0 < (int)uVar7) {
        uVar6 = 0;
        dVar3 = 0;
        do {
          uVar9 = uVar9 - 1;
          dVar3 = dVar3 | (uint)((dVar4 >> (uVar6 & 0x1f) & 1) != 0) << ((byte)uVar9 & 0x1f);
          uVar6 = uVar6 + 1;
        } while (uVar7 != uVar6);
      }
    }
  }
  return dVar3;
}

Assistant:

deUint32 getNext (int num)
	{
		if (num == 0 || m_ndx >= m_length)
			return 0;

		const int end				= m_ndx + num;
		const int numBitsFromSrc	= de::max(0, de::min(m_length, end) - m_ndx);
		const int low				= m_ndx;
		const int high				= m_ndx + numBitsFromSrc - 1;

		m_ndx += num;

		return m_forward ?			   m_src.getBits(m_startNdxInSrc + low,  m_startNdxInSrc + high)
						 : reverseBits(m_src.getBits(m_startNdxInSrc - high, m_startNdxInSrc - low), numBitsFromSrc);
	}